

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O0

ck_uint32 upack_int(char **buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  ck_uint32 uval;
  uchar *ubuf;
  char **buf_local;
  
  pbVar5 = (byte *)*buf;
  bVar1 = *pbVar5;
  bVar2 = pbVar5[1];
  bVar3 = pbVar5[2];
  bVar4 = pbVar5[3];
  *buf = *buf + 4;
  return (uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4;
}

Assistant:

static ck_uint32 upack_int(char **buf)
{
    unsigned char *ubuf = (unsigned char *)*buf;
    ck_uint32 uval;

    uval =
        (ck_uint32) ((ubuf[0] << 24) | (ubuf[1] << 16) | (ubuf[2] << 8) |
                     ubuf[3]);

    *buf += 4;

    return uval;
}